

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

int __thiscall ncnn::Fold::forward(Fold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Mat *pMVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  void *pvVar20;
  int v;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int i;
  int iVar26;
  float *pfVar27;
  int _w;
  int _h;
  float *pfVar28;
  Mat local_128;
  Mat *local_e0;
  Mat *local_d8;
  size_t local_d0;
  int local_c8;
  int local_c4;
  Option *local_c0;
  void *local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  void *local_90;
  long local_88;
  ulong local_80;
  Option opt_b;
  
  iVar2 = this->kernel_h;
  iVar3 = this->dilation_h;
  _w = this->output_w + this->pad_left + this->pad_right;
  _h = this->output_h + this->pad_top + this->pad_bottom;
  iVar21 = iVar2 * this->kernel_w;
  local_d0 = bottom_blob->elemsize;
  uVar23 = (~((this->kernel_w + -1) * this->dilation_w) + _w) / this->stride_w;
  iVar4 = this->stride_h;
  uVar18 = (long)bottom_blob->h / (long)iVar21;
  uVar15 = uVar18 & 0xffffffff;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  if ((this->pad_bottom < 1 && this->pad_top < 1) && (this->pad_right < 1 && this->pad_left < 1)) {
    lVar17 = 8;
    if (&local_128 != top_blob) {
      piVar8 = top_blob->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_128.data = top_blob->data;
      local_128.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_128.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_128.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_128.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_128.elempack = top_blob->elempack;
      local_128.allocator = top_blob->allocator;
      uVar9 = top_blob->dims;
      uVar10 = top_blob->w;
      uVar11 = top_blob->h;
      uVar12 = top_blob->d;
      local_128.c = top_blob->c;
      local_128.cstep = top_blob->cstep;
      local_128.dims = uVar9;
      local_128.w = uVar10;
      local_128.h = uVar11;
      local_128.d = uVar12;
    }
  }
  else {
    lVar17 = 0x10;
  }
  iVar19 = (int)uVar18;
  local_e0 = top_blob;
  local_d8 = bottom_blob;
  local_c0 = opt;
  Mat::create(&local_128,_w,_h,iVar19,local_d0,*(Allocator **)(&opt->lightmode + lVar17));
  pMVar13 = local_e0;
  iVar14 = -100;
  local_b8 = local_128.data;
  if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
    iVar14 = this->stride_h;
    iVar5 = this->stride_w;
    local_90 = local_d8->data;
    piVar8 = &local_d8->w;
    psVar1 = &local_d8->elemsize;
    local_c4 = local_128.d;
    local_a0 = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
    local_88 = local_128.cstep * local_a0;
    local_98 = (long)local_128.h * (long)local_128.w;
    local_a8 = local_a0 * local_98 + 0xf & 0xfffffffffffffff0;
    local_c8 = local_128.dims;
    iVar24 = this->kernel_h;
    local_d8 = (Mat *)((long)local_128.w * local_a0);
    if (iVar24 < 1) {
      iVar24 = 0;
    }
    local_d0 = CONCAT44(local_d0._4_4_,iVar24);
    if (iVar19 < 1) {
      uVar15 = 0;
    }
    local_b0 = (long)iVar21 * (long)*piVar8 * *psVar1;
    uVar18 = 0;
    pvVar20 = local_128.data;
    while (uVar16 = uVar18, uVar16 != uVar15) {
      iVar21 = (int)local_98;
      if (local_128.dims != 4) {
        iVar21 = (int)(local_a8 / local_a0);
      }
      iVar19 = iVar21 * local_128.d;
      if (iVar21 * local_128.d < 1) {
        iVar19 = 0;
      }
      for (lVar17 = 0; iVar19 != (int)lVar17; lVar17 = lVar17 + 1) {
        *(undefined4 *)((long)pvVar20 + lVar17 * 4) = 0;
      }
      pfVar28 = (float *)(uVar16 * local_b0 + (long)local_90);
      iVar21 = 0;
      uVar18 = (ulong)(uint)this->kernel_w;
      if (this->kernel_w < 1) {
        uVar18 = 0;
      }
      for (; iVar21 != iVar24; iVar21 = iVar21 + 1) {
        iVar19 = this->dilation_h;
        iVar6 = this->dilation_w;
        for (uVar22 = 0; uVar22 != uVar18; uVar22 = uVar22 + 1) {
          pfVar27 = (float *)((long)local_128.data +
                             uVar22 * (long)iVar6 * 4 +
                             (long)iVar21 * (long)iVar19 * (long)local_d8 + local_88 * uVar16);
          for (iVar26 = 0; iVar26 <= (~((iVar2 + -1) * iVar3) + _h) / iVar4; iVar26 = iVar26 + 1) {
            iVar7 = this->stride_w;
            for (iVar25 = 0; iVar25 <= (int)uVar23; iVar25 = iVar25 + 1) {
              *pfVar27 = *pfVar27 + *pfVar28;
              pfVar28 = pfVar28 + 1;
              pfVar27 = pfVar27 + iVar7;
            }
            pfVar27 = pfVar27 + (int)(~uVar23 * iVar5 + _w * iVar14);
          }
        }
      }
      pvVar20 = (void *)((long)pvVar20 + local_88);
      local_80 = uVar16;
      uVar18 = uVar16 + 1;
    }
    if ((this->pad_bottom < 1 && this->pad_top < 1) && (this->pad_right < 1 && this->pad_left < 1))
    {
      if (&local_128 != local_e0) {
        piVar8 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + 1;
          UNLOCK();
        }
        piVar8 = local_e0->refcount;
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_e0->allocator == (Allocator *)0x0) {
              free(local_e0->data);
            }
            else {
              (*local_e0->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar13->data = local_128.data;
        pMVar13->refcount = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
        pMVar13->elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
        pMVar13->elempack = local_128.elempack;
        pMVar13->allocator = local_128.allocator;
        pMVar13->dims = local_128.dims;
        pMVar13->w = local_128.w;
        pMVar13->h = local_128.h;
        pMVar13->d = local_128.d;
        pMVar13->c = local_128.c;
        pMVar13->cstep = local_128.cstep;
      }
    }
    else {
      opt_b.lightmode = local_c0->lightmode;
      opt_b.use_shader_pack8 = local_c0->use_shader_pack8;
      opt_b.use_subgroup_ops = local_c0->use_subgroup_ops;
      opt_b.use_reserved_0 = local_c0->use_reserved_0;
      opt_b.num_threads = local_c0->num_threads;
      opt_b.blob_allocator = local_c0->blob_allocator;
      opt_b.workspace_allocator = local_c0->workspace_allocator;
      opt_b.openmp_blocktime = local_c0->openmp_blocktime;
      opt_b.use_winograd_convolution = local_c0->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_c0->use_sgemm_convolution;
      opt_b.use_int8_inference = local_c0->use_int8_inference;
      opt_b.use_vulkan_compute = local_c0->use_vulkan_compute;
      uVar18._0_1_ = local_c0->use_bf16_storage;
      uVar18._1_1_ = local_c0->use_fp16_packed;
      uVar18._2_1_ = local_c0->use_fp16_storage;
      uVar18._3_1_ = local_c0->use_fp16_arithmetic;
      uVar18._4_1_ = local_c0->use_int8_packed;
      uVar18._5_1_ = local_c0->use_int8_storage;
      uVar18._6_1_ = local_c0->use_int8_arithmetic;
      uVar18._7_1_ = local_c0->use_packing_layout;
      opt_b.vulkan_device_index = local_c0->vulkan_device_index;
      opt_b.use_reserved_1 = local_c0->use_reserved_1;
      opt_b.use_image_storage = local_c0->use_image_storage;
      opt_b.use_tensor_storage = local_c0->use_tensor_storage;
      opt_b.use_reserved_2 = local_c0->use_reserved_2;
      opt_b.flush_denormals = local_c0->flush_denormals;
      opt_b.use_local_pool_allocator = local_c0->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_c0->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_c0->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_c0->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_c0->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_c0->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_c0->use_a53_a55_optimized_kernel;
      opt_b.use_fp16_uniform = local_c0->use_fp16_uniform;
      opt_b.use_int8_uniform = local_c0->use_int8_uniform;
      opt_b.use_reserved_9 = local_c0->use_reserved_9;
      opt_b.use_reserved_10 = local_c0->use_reserved_10;
      opt_b.use_reserved_11 = local_c0->use_reserved_11;
      opt_b._32_8_ = uVar18 & 0xffffffffffffff;
      copy_cut_border(&local_128,local_e0,this->pad_top,this->pad_bottom,this->pad_left,
                      this->pad_right,&opt_b);
      iVar14 = -100;
      if ((pMVar13->data == (void *)0x0) || ((long)pMVar13->c * pMVar13->cstep == 0))
      goto LAB_0051f181;
    }
    iVar14 = 0;
  }
LAB_0051f181:
  piVar8 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int Fold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int max_channels = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = output_w + pad_left + pad_right;
    const int outh = output_h + pad_top + pad_bottom;

    const int inw = (outw - kernel_extent_w) / stride_w + 1;
    const int inh = (outh - kernel_extent_h) / stride_h + 1;

    // assert inw * inh == size

    const int maxk = kernel_w * kernel_h;
    const int channels = max_channels / maxk;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, channels, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    // col2im
    const int gap = outw * stride_h - inw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* sptr = bottom_blob.row(p * maxk);
        Mat outm = top_blob_bordered.channel(p);

        outm.fill(0.f);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < inh; i++)
                {
                    for (int j = 0; j < inw; j++)
                    {
                        ptr[0] += sptr[0];

                        ptr += stride_w;
                        sptr += 1;
                    }

                    ptr += gap;
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.use_packing_layout = false;
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt_b);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}